

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O3

void __thiscall amrex::Cluster::minBox(Cluster *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  IntVect *pIVar4;
  int iVar5;
  long lVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  
  lVar6 = this->m_len;
  if (lVar6 == 0) {
    (this->m_bx).smallend.vect[0] = 1;
    (this->m_bx).smallend.vect[1] = 1;
    (this->m_bx).smallend.vect[2] = 1;
    (this->m_bx).bigend.vect[0] = 0;
    (this->m_bx).bigend.vect[1] = 0;
    *(undefined8 *)((this->m_bx).bigend.vect + 2) = 0;
    return;
  }
  pIVar4 = this->m_ar;
  iVar10 = pIVar4->vect[0];
  iVar11 = pIVar4->vect[1];
  iVar5 = pIVar4->vect[2];
  iVar8 = iVar11;
  iVar9 = iVar10;
  iVar12 = iVar5;
  if (1 < lVar6) {
    piVar7 = pIVar4[1].vect + 2;
    lVar6 = lVar6 + -1;
    do {
      iVar1 = ((IntVect *)(piVar7 + -2))->vect[0];
      if (iVar1 <= iVar9) {
        iVar9 = iVar1;
      }
      iVar2 = piVar7[-1];
      if (iVar2 <= iVar8) {
        iVar8 = iVar2;
      }
      iVar3 = *piVar7;
      if (iVar3 <= iVar5) {
        iVar5 = iVar3;
      }
      if (iVar1 < iVar10) {
        iVar1 = iVar10;
      }
      iVar10 = iVar1;
      if (iVar2 < iVar11) {
        iVar2 = iVar11;
      }
      iVar11 = iVar2;
      if (iVar3 < iVar12) {
        iVar3 = iVar12;
      }
      iVar12 = iVar3;
      piVar7 = piVar7 + 3;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  (this->m_bx).smallend.vect[0] = iVar9;
  (this->m_bx).smallend.vect[1] = iVar8;
  (this->m_bx).smallend.vect[2] = iVar5;
  (this->m_bx).bigend.vect[0] = iVar10;
  (this->m_bx).bigend.vect[1] = iVar11;
  (this->m_bx).bigend.vect[2] = iVar12;
  (this->m_bx).btype.itype = 0;
  return;
}

Assistant:

void
Cluster::minBox () noexcept
{
    if (m_len == 0)
    {
        m_bx = Box();
    }
    else
    {
        IntVect lo = m_ar[0], hi = lo;
        for (int i = 1; i < m_len; i++)
        {
            lo.min(m_ar[i]);
            hi.max(m_ar[i]);
        }
        m_bx = Box(lo,hi);
    }
}